

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode readIsAbstractAttribute(UA_Node *node,UA_Variant *v)

{
  UA_NodeClass UVar1;
  UA_Node *local_28;
  UA_Boolean *isAbstract;
  UA_Variant *v_local;
  UA_Node *node_local;
  
  UVar1 = node->nodeClass;
  if (UVar1 == UA_NODECLASS_OBJECTTYPE) {
    local_28 = node + 1;
  }
  else if (UVar1 == UA_NODECLASS_VARIABLETYPE) {
    local_28 = (UA_Node *)&node[2].browseName;
  }
  else if (UVar1 == UA_NODECLASS_REFERENCETYPE) {
    local_28 = node + 1;
  }
  else {
    if (UVar1 != UA_NODECLASS_DATATYPE) {
      return 0x80350000;
    }
    local_28 = node + 1;
  }
  forceVariantSetScalar(v,local_28,UA_TYPES);
  return 0;
}

Assistant:

static UA_StatusCode
readIsAbstractAttribute(const UA_Node *node, UA_Variant *v) {
    const UA_Boolean *isAbstract;
    switch(node->nodeClass) {
    case UA_NODECLASS_REFERENCETYPE:
        isAbstract = &((const UA_ReferenceTypeNode*)node)->isAbstract;
        break;
    case UA_NODECLASS_OBJECTTYPE:
        isAbstract = &((const UA_ObjectTypeNode*)node)->isAbstract;
        break;
    case UA_NODECLASS_VARIABLETYPE:
        isAbstract = &((const UA_VariableTypeNode*)node)->isAbstract;
        break;
    case UA_NODECLASS_DATATYPE:
        isAbstract = &((const UA_DataTypeNode*)node)->isAbstract;
        break;
    default:
        return UA_STATUSCODE_BADATTRIBUTEIDINVALID;
    }
    forceVariantSetScalar(v, isAbstract, &UA_TYPES[UA_TYPES_BOOLEAN]);
    return UA_STATUSCODE_GOOD;
}